

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

bool __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
ImplicitProducer::
enqueue<(duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,duckdb::BufferEvictionNode>
          (ImplicitProducer *this,BufferEvictionNode *element)

{
  ulong blockStartIndex;
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  BlockIndexEntry *in_RAX;
  Block *pBVar4;
  long lVar5;
  BlockIndexEntry *idxEntry;
  BlockIndexEntry *local_28;
  
  blockStartIndex = *(ulong *)(this + 0x20);
  if ((blockStartIndex & 0x1f) == 0) {
    if ((*(long *)(this + 0x28) - blockStartIndex) + 0x7fffffffffffffdf < 0x7fffffffffffffff) {
      local_28 = in_RAX;
      bVar3 = insert_block_index_entry<(duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
                        (this,&local_28,blockStartIndex);
      if (bVar3) {
        pBVar4 = requisition_block<(duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
                           (*(ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                              **)(this + 0x50));
        if (pBVar4 != (Block *)0x0) {
          (pBVar4->elementsCompletelyDequeued).super___atomic_base<unsigned_long>._M_i = 0;
          (local_28->value)._M_b._M_p = pBVar4;
          *(Block **)(this + 0x40) = pBVar4;
          goto LAB_014ba279;
        }
        plVar1 = *(long **)(this + 0x60);
        plVar1[1] = *plVar1 - 1U & plVar1[1] - 1U;
        (local_28->value)._M_b._M_p = (__pointer_type)0x0;
      }
    }
    bVar3 = false;
  }
  else {
    pBVar4 = *(Block **)(this + 0x40);
LAB_014ba279:
    lVar5 = (blockStartIndex & 0x1f) * 0x18;
    p_Var2 = (element->handle).internal.
             super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    *(element_type **)(pBVar4->elements + lVar5) =
         (element->handle).internal.
         super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pBVar4->elements + lVar5 + 8) = p_Var2;
    (element->handle).internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (element->handle).internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(idx_t *)(pBVar4->elements + lVar5 + 0x10) = element->handle_sequence_number;
    *(ulong *)(this + 0x20) = blockStartIndex + 1;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

inline bool enqueue(U&& element)
		{
			index_t currentTailIndex = this->tailIndex.load(std::memory_order_relaxed);
			index_t newTailIndex = 1 + currentTailIndex;
			if ((currentTailIndex & static_cast<index_t>(BLOCK_SIZE - 1)) == 0) {
				// We reached the end of a block, start a new one
				auto head = this->headIndex.load(std::memory_order_relaxed);
				assert(!details::circular_less_than<index_t>(currentTailIndex, head));
				if (!details::circular_less_than<index_t>(head, currentTailIndex + BLOCK_SIZE) || (MAX_SUBQUEUE_SIZE != details::const_numeric_max<size_t>::value && (MAX_SUBQUEUE_SIZE == 0 || MAX_SUBQUEUE_SIZE - BLOCK_SIZE < currentTailIndex - head))) {
					return false;
				}
#ifdef MCDBGQ_NOLOCKFREE_IMPLICITPRODBLOCKINDEX
				debug::DebugLock lock(mutex);
#endif
				// Find out where we'll be inserting this block in the block index
				BlockIndexEntry* idxEntry;
				if (!insert_block_index_entry<allocMode>(idxEntry, currentTailIndex)) {
					return false;
				}
				
				// Get ahold of a new block
				auto newBlock = this->parent->ConcurrentQueue::template requisition_block<allocMode>();
				if (newBlock == nullptr) {
					rewind_block_index_tail();
					idxEntry->value.store(nullptr, std::memory_order_relaxed);
					return false;
				}
#ifdef MCDBGQ_TRACKMEM
				newBlock->owner = this;
#endif
				newBlock->ConcurrentQueue::Block::template reset_empty<implicit_context>();
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new ((T*)nullptr) T(std::forward<U>(element)))) {
					// May throw, try to insert now before we publish the fact that we have this new block
					MOODYCAMEL_TRY {
						new ((*newBlock)[currentTailIndex]) T(std::forward<U>(element));
					}
					MOODYCAMEL_CATCH (...) {
						rewind_block_index_tail();
						idxEntry->value.store(nullptr, std::memory_order_relaxed);
						this->parent->add_block_to_free_list(newBlock);
						MOODYCAMEL_RETHROW;
					}
				}
				
				// Insert the new block into the index
				idxEntry->value.store(newBlock, std::memory_order_relaxed);
				
				this->tailBlock = newBlock;
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new ((T*)nullptr) T(std::forward<U>(element)))) {
					this->tailIndex.store(newTailIndex, std::memory_order_release);
					return true;
				}
			}